

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rewriting.cpp
# Opt level: O1

tuple<NS_*,_NS_*,_NS_*> *
test_graphs::nat_has(tuple<NS_*,_NS_*,_NS_*> *__return_storage_ptr__,bool replacement)

{
  NS *pNVar1;
  N *pNVar2;
  N *pNVar3;
  N *pNVar4;
  N *this;
  N *this_00;
  N *pNVar5;
  NS *graph;
  int __fd;
  undefined7 in_register_00000031;
  N *local_68;
  N *local_60;
  int local_54;
  N *local_50;
  N *local_48;
  NS *local_40;
  tuple<NS_*,_NS_*,_NS_*> *local_38;
  
  local_54 = (int)CONCAT71(in_register_00000031,replacement);
  local_38 = __return_storage_ptr__;
  pNVar1 = (NS *)operator_new(0x18);
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_60 = (N *)N::operator_new(0x78,pNVar1);
  N::N<char_const*>(local_60,"Box");
  pNVar2 = (N *)N::operator_new(0x78,pNVar1);
  N::N<char_const*>(pNVar2,"Pyramid");
  local_48 = (N *)N::operator_new(0x78,pNVar1);
  N::N<char_const*>(local_48,"Ball");
  pNVar3 = (N *)N::operator_new(0x78,pNVar1);
  N::N<char_const*>(pNVar3,"Left");
  local_50 = (N *)N::operator_new(0x78,pNVar1);
  N::N<char_const*>(local_50,"Right");
  pNVar4 = (N *)N::operator_new(0x78,pNVar1);
  N::N<char_const*>(pNVar4,"Top");
  this = (N *)N::operator_new(0x78,pNVar1);
  N::N<char_const*>(this,"Bottom");
  local_40 = pNVar1;
  this_00 = (N *)N::operator_new(0x78,pNVar1);
  N::N<char_const*>(this_00,"opposite");
  pNVar5 = local_60;
  local_68 = pNVar2;
  N::connect(local_60,(int)pNVar3,(sockaddr *)&local_68,1);
  local_68 = local_48;
  N::connect(pNVar5,(int)pNVar4,(sockaddr *)&local_68,1);
  pNVar5 = local_50;
  local_68 = local_50;
  __fd = (int)this_00;
  N::connect(pNVar3,__fd,(sockaddr *)&local_68,1);
  local_68 = pNVar3;
  N::connect(pNVar5,__fd,(sockaddr *)&local_68,1);
  local_68 = this;
  N::connect(pNVar4,__fd,(sockaddr *)&local_68,1);
  local_68 = pNVar4;
  N::connect(this,__fd,(sockaddr *)&local_68,1);
  pNVar1 = (NS *)operator_new(0x18);
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pNVar5 = (N *)N::operator_new(0x78,pNVar1);
  N::N<char_const*>(pNVar5,"Object 1");
  pNVar2 = (N *)N::operator_new(0x78,pNVar1);
  N::N<char_const*>(pNVar2,"Object 2");
  pNVar3 = (N *)N::operator_new(0x78,pNVar1);
  N::N<char_const*>(pNVar3,"generic property");
  pNVar4 = (N *)N::operator_new(0x78,pNVar1);
  N::N<char_const*>(pNVar4,"generic anti property");
  local_68 = pNVar2;
  local_60 = pNVar2;
  N::connect(pNVar5,(int)pNVar3,(sockaddr *)&local_68,1);
  local_68 = pNVar4;
  N::connect(pNVar3,__fd,(sockaddr *)&local_68,1);
  graph = (NS *)operator_new(0x18);
  *(undefined8 *)&(graph->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl = 0;
  *(pointer *)((long)&(graph->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl + 8) =
       (pointer)0x0;
  *(pointer *)((long)&(graph->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl + 0x10) =
       (pointer)0x0;
  pNVar2 = (N *)N::operator_new(0x78,graph);
  N::N<char_const*>(pNVar2,"new");
  pNVar2 = (N *)N::operator_new(0x78,graph);
  N::N<char_const*>(pNVar2,"match");
  if (local_54 != 0) {
    local_68 = pNVar5;
    N::connect(local_60,(int)pNVar4,(sockaddr *)&local_68,1);
  }
  (local_38->super__Tuple_impl<0UL,_NS_*,_NS_*,_NS_*>).super__Tuple_impl<1UL,_NS_*,_NS_*>.
  super__Tuple_impl<2UL,_NS_*>.super__Head_base<2UL,_NS_*,_false>._M_head_impl = graph;
  (local_38->super__Tuple_impl<0UL,_NS_*,_NS_*,_NS_*>).super__Tuple_impl<1UL,_NS_*,_NS_*>.
  super__Head_base<1UL,_NS_*,_false>._M_head_impl = pNVar1;
  (local_38->super__Tuple_impl<0UL,_NS_*,_NS_*,_NS_*>).super__Head_base<0UL,_NS_*,_false>.
  _M_head_impl = local_40;
  return local_38;
}

Assistant:

std::tuple<NS*, NS*, NS*> test_graphs::nat_has(bool replacement) {
    auto g = new NS();
    auto n1 = new(g) N("Box"), n2 = new(g) N("Pyramid"), n3 = new(g) N("Ball");
    auto has = new(g) N("Left"), is = new(g) N("Right");
    auto top = new(g) N("Top"), bot = new(g) N("Bottom");
    auto opp = new(g) N("opposite");

    n1->connect(has, {n2});
    n1->connect(top, {n3});
    has->connect(opp, {is});
    is->connect(opp, {has});
    top->connect(opp, {bot});
    bot->connect(opp, {top});

    auto to_match = new NS();
    auto x = new(to_match) N("Object 1"), y = new(to_match) N("Object 2");
    auto p = new(to_match) N("generic property"), np = new(to_match) N("generic anti property");
    x->connect(p, {y});
    p->connect(opp, {np});

    auto changed = new NS();
    auto add_e = new(changed) N("new");
    auto m = new(changed) N("match");

    if (replacement) {
        y->connect(np, {x});
        //y->connect(add_e, {x});
    }

    return {g, to_match, changed};
}